

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

int run_test_fs_event_watch_dir(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  puVar2 = uv_default_loop();
  fs_event_unlink_files((uv_timer_t *)0x0);
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  iVar1 = uv_fs_event_init(puVar2,&fs_event);
  if (iVar1 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_dir_multi_file,"watch_dir",0);
    if (iVar1 == 0) {
      iVar1 = uv_timer_init(puVar2,&timer);
      if (iVar1 == 0) {
        iVar1 = uv_timer_start(&timer,fs_event_create_files,100,0);
        if (iVar1 == 0) {
          uv_run(puVar2,UV_RUN_DEFAULT);
          if (fs_event_cb_called == fs_event_removed + fs_event_created) {
            if (close_cb_called == 2) {
              fs_event_unlink_files((uv_timer_t *)0x0);
              remove("watch_dir/file2");
              remove("watch_dir/file1");
              remove("watch_dir/");
              puVar2 = uv_default_loop();
              close_loop(puVar2);
              puVar2 = uv_default_loop();
              iVar1 = uv_loop_close(puVar2);
              if (iVar1 == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar4 = "0 == uv_loop_close(uv_default_loop())";
              uVar3 = 0x1cd;
            }
            else {
              pcVar4 = "close_cb_called == 2";
              uVar3 = 0x1c5;
            }
          }
          else {
            pcVar4 = "fs_event_cb_called == fs_event_created + fs_event_removed";
            uVar3 = 0x1c4;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x1c0;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x1be;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0x1bc;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x1ba;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-event.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_event_watch_dir) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#elif defined(__MVS__)
  RETURN_SKIP("Directory watching not supported on this platform.");
#endif

  uv_loop_t* loop = uv_default_loop();
  int r;

  /* Setup */
  fs_event_unlink_files(NULL);
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_dir_multi_file, "watch_dir", 0);
  ASSERT(r == 0);
  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);
  r = uv_timer_start(&timer, fs_event_create_files, 100, 0);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(fs_event_cb_called == fs_event_created + fs_event_removed);
  ASSERT(close_cb_called == 2);

  /* Cleanup */
  fs_event_unlink_files(NULL);
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY();
  return 0;
}